

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_table_add_union(flatcc_builder_t *B,int id,flatcc_builder_union_ref_t uref)

{
  flatcc_builder_ref_t *pfVar1;
  void *p;
  flatcc_builder_utype_t *putype;
  flatcc_builder_ref_t *pref;
  int id_local;
  flatcc_builder_t *B_local;
  int iStack_10;
  flatcc_builder_union_ref_t uref_local;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x60d,
                  "int flatcc_builder_table_add_union(flatcc_builder_t *, int, flatcc_builder_union_ref_t)"
                 );
  }
  B_local._4_1_ = uref.type;
  iStack_10 = uref.value;
  if ((B_local._4_1_ == '\0') && (iStack_10 != 0)) {
    if (iStack_10 != 0) {
      __assert_fail("uref.type != 0 || uref.value == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x60e,
                    "int flatcc_builder_table_add_union(flatcc_builder_t *, int, flatcc_builder_union_ref_t)"
                   );
    }
    uref_local.type = 0xff;
    uref_local._1_3_ = 0xffffff;
  }
  else {
    if (iStack_10 != 0) {
      pfVar1 = flatcc_builder_table_add_offset(B,id);
      if (pfVar1 == (flatcc_builder_ref_t *)0x0) {
        __assert_fail("pref != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x611,
                      "int flatcc_builder_table_add_union(flatcc_builder_t *, int, flatcc_builder_union_ref_t)"
                     );
      }
      *pfVar1 = iStack_10;
    }
    p = flatcc_builder_table_add(B,id + -1,1,1);
    if (p == (void *)0x0) {
      __assert_fail("putype != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x615,
                    "int flatcc_builder_table_add_union(flatcc_builder_t *, int, flatcc_builder_union_ref_t)"
                   );
    }
    __flatbuffers_utype_write_to_pe(p,B_local._4_1_);
    uref_local.type = '\0';
    uref_local._1_3_ = 0;
  }
  return uref_local._0_4_;
}

Assistant:

int flatcc_builder_table_add_union(flatcc_builder_t *B, int id,
    flatcc_builder_union_ref_t uref)
{
    flatcc_builder_ref_t *pref;
    flatcc_builder_utype_t *putype;

    check(frame(type) == flatcc_builder_table, "expected table frame");
    check_error(uref.type != 0 || uref.value == 0, -1, "expected null value for type NONE");
    if (uref.value != 0) {
        pref = flatcc_builder_table_add_offset(B, id);
        check_error(pref != 0, -1, "unable to add union value");
        *pref = uref.value;
    }
    putype = flatcc_builder_table_add(B, id - 1, utype_size, utype_size);
    check_error(putype != 0, -1, "unable to add union type");
    write_utype(putype, uref.type);
    return 0;
}